

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::push_reg(Rdma *this,void *addr,size_t size)

{
  size_t *psVar1;
  pointer *ppPVar2;
  pointer puVar3;
  pointer pMVar4;
  iterator __position;
  _List_node_base *p_Var5;
  long lVar6;
  mapped_type *pmVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  size_type __new_size;
  long lVar10;
  _Node_alloc_type *__alloc;
  void *local_58;
  PushEntry local_50;
  
  puVar3 = (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58 = addr;
  if ((this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start == puVar3) {
    pMVar4 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(this->m_used_slots).
                   super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
            -0x5555555555555555;
    p_Var5 = (_List_node_base *)(uVar9 / (ulong)(long)this->m_nprocs);
    lVar6 = (long)(this->m_used_slots).
                  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar4 >> 3;
    __new_size = uVar9 + (long)this->m_nprocs;
    if ((ulong)(lVar6 * -0x5555555555555555) < __new_size) {
      uVar9 = lVar6 * 0x5555555555555556;
      if (uVar9 <= __new_size) {
        uVar9 = __new_size;
      }
      std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::reserve
                (&this->m_used_slots,uVar9);
      __new_size = ((long)(this->m_used_slots).
                          super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_used_slots).
                          super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                   (long)this->m_nprocs;
    }
    std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::resize
              (&this->m_used_slots,__new_size);
  }
  else {
    p_Var5 = (_List_node_base *)puVar3[-1];
    (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3 + -1;
  }
  lVar6 = (long)this->m_pid;
  lVar10 = (long)this->m_nprocs * (long)p_Var5;
  pMVar4 = (this->m_used_slots).
           super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar4[lVar10 + lVar6].addr = addr;
  pMVar4[lVar10 + lVar6].size = size;
  pMVar4[lVar10 + lVar6].status = 1;
  pmVar7 = std::__detail::
           _Map_base<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_register,&local_58);
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = p_Var5;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(pmVar7->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  local_50.block.status = 1;
  __position._M_current =
       (this->m_send_push_pop_comm_buf).m_pushed_slots.
       super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_send_push_pop_comm_buf).m_pushed_slots.
      super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50.block.addr = addr;
    local_50.block.size = size;
    local_50.slot = (Memslot)p_Var5;
    std::
    vector<bsplib::Rdma::PushPopCommBuf::PushEntry,std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>>
    ::_M_realloc_insert<bsplib::Rdma::PushPopCommBuf::PushEntry_const&>
              ((vector<bsplib::Rdma::PushPopCommBuf::PushEntry,std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>>
                *)&this->m_send_push_pop_comm_buf,__position,&local_50);
  }
  else {
    *(ulong *)&((__position._M_current)->block).status = CONCAT44(local_50.block._20_4_,1);
    (__position._M_current)->slot = (Memslot)p_Var5;
    ((__position._M_current)->block).addr = addr;
    ((__position._M_current)->block).size = size;
    ppPVar2 = &(this->m_send_push_pop_comm_buf).m_pushed_slots.
               super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar2 = *ppPVar2 + 1;
  }
  return;
}

Assistant:

void Rdma::push_reg( void * addr, size_t size )
{
    Memslot id = no_slot();
    if ( m_free_slots.empty() ) {
        id = m_used_slots.size() / m_nprocs;

        if ( m_used_slots.capacity() < m_used_slots.size() + m_nprocs )
            m_used_slots.reserve( std::max(
                        2*m_used_slots.capacity(),
                        m_used_slots.size() + m_nprocs ) );

        m_used_slots.resize( m_used_slots.size() + m_nprocs );
    }
    else {
        id = m_free_slots.back();
        m_free_slots.pop_back();
    }

    Memblock block = { addr, size, Memblock::PUSHED };
    slot( m_pid, id ) = block;
    m_register[ addr ].push_back( id );

    PushPopCommBuf::PushEntry entry = { block, id };
    m_send_push_pop_comm_buf.m_pushed_slots.push_back( entry );
}